

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delimited_message_util.cc
# Opt level: O2

bool google::protobuf::util::ParseDelimitedFromCodedStream
               (MessageLite *message,CodedInputStream *input,bool *clean_eof)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  Limit limit;
  undefined8 in_RAX;
  uint32_t size;
  uint32_t local_34;
  
  local_34 = (uint32_t)((ulong)in_RAX >> 0x20);
  if (clean_eof != (bool *)0x0) {
    *clean_eof = false;
  }
  iVar1 = *(int *)&input->buffer_;
  iVar2 = input->total_bytes_read_;
  iVar3 = *(int *)&input->buffer_end_;
  iVar4 = input->buffer_size_after_limit_;
  bVar5 = io::CodedInputStream::ReadVarint32(input,&local_34);
  if (bVar5) {
    iVar1 = *(int *)&input->buffer_end_;
    iVar2 = input->total_bytes_read_;
    iVar3 = *(int *)&input->buffer_;
    iVar4 = input->buffer_size_after_limit_;
    limit = io::CodedInputStream::PushLimit(input,local_34);
    bVar5 = MessageLite::MergeFromCodedStream(message,input);
    if (((bVar5) && (input->legitimate_message_end_ == true)) &&
       ((((iVar4 - iVar2) + (iVar1 - iVar3) + input->total_bytes_read_) -
        input->buffer_size_after_limit_) + (*(int *)&input->buffer_ - *(int *)&input->buffer_end_)
        == local_34)) {
      io::CodedInputStream::PopLimit(input,limit);
      return true;
    }
  }
  else if (clean_eof != (bool *)0x0) {
    *clean_eof = (input->total_bytes_read_ - input->buffer_size_after_limit_) +
                 (*(int *)&input->buffer_ - *(int *)&input->buffer_end_) ==
                 (iVar2 - iVar4) + (iVar1 - iVar3);
  }
  return false;
}

Assistant:

bool ParseDelimitedFromCodedStream(MessageLite* message,
                                   io::CodedInputStream* input,
                                   bool* clean_eof) {
  if (clean_eof != nullptr) *clean_eof = false;
  int start = input->CurrentPosition();

  // Read the size.
  uint32_t size;
  if (!input->ReadVarint32(&size)) {
    if (clean_eof != nullptr) *clean_eof = input->CurrentPosition() == start;
    return false;
  }

  // Get the position after any size bytes have been read (and only the message
  // itself remains).
  int position_after_size = input->CurrentPosition();

  // Tell the stream not to read beyond that size.
  io::CodedInputStream::Limit limit = input->PushLimit(static_cast<int>(size));

  // Parse the message.
  if (!message->MergeFromCodedStream(input)) return false;
  if (!input->ConsumedEntireMessage()) return false;
  if (input->CurrentPosition() - position_after_size != static_cast<int>(size))
    return false;

  // Release the limit.
  input->PopLimit(limit);

  return true;
}